

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  char cVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int i;
  ImGuiTableInstanceData *pIVar6;
  char *pcVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiTable *in_RDI;
  float fVar9;
  ImGuiButtonFlags unaff_retaddr;
  bool *in_stack_00000008;
  bool pressed;
  bool held;
  bool *in_stack_00000010;
  bool hovered;
  ImRect hit_rect;
  ImGuiID column_id;
  float border_y2_hit;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float hit_y2_head;
  float hit_y2_body;
  float hit_y1;
  float hit_half_width;
  ImGuiTableInstanceData *table_instance;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float y1;
  float in_stack_ffffffffffffffac;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffb0;
  ImGuiItemFlags in_stack_ffffffffffffffb4;
  ImRect *in_stack_ffffffffffffffb8;
  float id;
  int local_2c;
  
  pIVar4 = GImGui;
  pIVar6 = TableGetInstanceData
                     ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0)
  ;
  fVar1 = (in_RDI->OuterRect).Min.y;
  fVar9 = ImMax<float>((in_RDI->OuterRect).Max.y,fVar1 + pIVar6->LastOuterHeight);
  fVar2 = pIVar6->LastFirstRowHeight;
  for (local_2c = 0; local_2c < in_RDI->ColumnsCount; local_2c = local_2c + 1) {
    if ((in_RDI->EnabledMaskByDisplayOrder & 1L << ((byte)local_2c & 0x3f)) != 0) {
      pcVar7 = ImSpan<signed_char>::operator[](&in_RDI->DisplayOrderToIndex,local_2c);
      cVar3 = *pcVar7;
      i = (int)cVar3;
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&in_RDI->Columns,i);
      if ((pIVar8->Flags & 0x40000020U) == 0) {
        y1 = fVar9;
        if ((in_RDI->Flags & 0x800U) != 0) {
          y1 = fVar1 + fVar2;
        }
        if ((((in_RDI->Flags & 0x800U) == 0) || ((in_RDI->IsUsingHeaders & 1U) != 0)) &&
           (((pIVar8->IsVisibleX & 1U) != 0 || (in_RDI->LastResizedColumn == i)))) {
          id = y1;
          TableGetColumnResizeID(in_RDI,i,(int)in_RDI->InstanceCurrent);
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,y1,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffffa0);
          ItemAdd((ImRect *)pIVar8,(ImGuiID)id,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
          uVar10 = (uint)in_stack_ffffffffffffffac & 0xffff;
          bVar5 = ButtonBehavior((ImRect *)hit_rect.Max,(ImGuiID)hit_rect.Min.y,in_stack_00000010,
                                 in_stack_00000008,unaff_retaddr);
          in_stack_ffffffffffffffac =
               (float)CONCAT22((short)(uVar10 >> 0x10),CONCAT11(bVar5,(char)uVar10));
          if ((bVar5) &&
             (bVar5 = IsMouseDoubleClicked((ImGuiMouseButton)in_stack_ffffffffffffffa4), bVar5)) {
            TableSetColumnWidthAutoSingle
                      ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
            ClearActiveID();
            in_stack_ffffffffffffffac = (float)((uint)in_stack_ffffffffffffffac & 0xffff);
          }
          if (((uint)in_stack_ffffffffffffffac & 0x10000) != 0) {
            if (in_RDI->LastResizedColumn == -1) {
              if (in_RDI->RightMostEnabledColumn == -1) {
                in_stack_ffffffffffffffa4 = -3.4028235e+38;
              }
              else {
                pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&in_RDI->Columns,(int)in_RDI->RightMostEnabledColumn);
                in_stack_ffffffffffffffa4 = pIVar8->MaxX;
              }
              in_RDI->ResizeLockMinContentsX2 = in_stack_ffffffffffffffa4;
            }
            in_RDI->ResizedColumn = cVar3;
            in_RDI->InstanceInteracted = in_RDI->InstanceCurrent;
          }
          if (((((uint)in_stack_ffffffffffffffac & 0x1000000) != 0) &&
              (0.06 < pIVar4->HoveredIdTimer)) || (((uint)in_stack_ffffffffffffffac & 0x10000) != 0)
             ) {
            in_RDI->HoveredColumnBorder = cVar3;
            SetMouseCursor(4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}